

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::finalizeTable(TranslateToFuzzReader *this)

{
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var1;
  Address AVar2;
  pointer ppGVar3;
  uint32_t uVar4;
  long lVar5;
  Const *pCVar6;
  _Head_base<0UL,_wasm::Table_*,_false> _Var7;
  ulong uVar8;
  char *pcVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  pointer ppGVar13;
  Address AVar14;
  Name NVar15;
  Literal local_98;
  Builder *local_80;
  pointer local_78;
  Random *local_70;
  FindAll<wasm::GlobalGet> local_68;
  pointer local_50;
  char *local_48;
  pointer local_40;
  TranslateToFuzzReader *local_38;
  
  puVar11 = (this->wasm->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != local_78) {
    local_80 = &this->builder;
    local_70 = &this->random;
    local_38 = this;
    do {
      _Var7._M_head_impl =
           (puVar11->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      pcVar9 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 8);
      if (pcVar9 == (char *)0x0) {
        __assert_fail("table.is() && \"Table name must not be null\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                      ,0x85,
                      "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp:803:26)]"
                     );
      }
      puVar10 = (local_38->wasm->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar12 = (local_38->wasm->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_50 = puVar11;
      local_48 = pcVar9;
      local_40 = puVar10;
      if (puVar12 != puVar10) {
        do {
          _Var1._M_head_impl =
               (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
          if (*(char **)((long)&(_Var1._M_head_impl)->table + 8) == pcVar9) {
            if (((local_38->wasm->features).features & 0x400) == 0) {
              FindAll<wasm::GlobalGet>::FindAll(&local_68,(_Var1._M_head_impl)->offset);
              ppGVar3 = local_68.list.
                        super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              for (ppGVar13 = local_68.list.
                              super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppGVar13 != ppGVar3;
                  ppGVar13 = ppGVar13 + 1) {
                NVar15.super_IString.str._M_str =
                     (char *)((*ppGVar13)->name).super_IString.str._M_len;
                NVar15.super_IString.str._M_len = (size_t)local_38->wasm;
                lVar5 = wasm::Module::getGlobal(NVar15);
                if (*(long *)(lVar5 + 0x20) != 0) {
                  __assert_fail("!wasm.getGlobal(get->name)->imported()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                                ,0x32b,
                                "auto wasm::TranslateToFuzzReader::finalizeTable()::(anonymous class)::operator()(ElementSegment *) const"
                               );
                }
                Literal::makeFromInt32
                          (&local_98,0,
                           (Type)(((local_50->_M_t).
                                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                   .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                                 addressType).id);
                pCVar6 = Builder::makeConst(local_80,&local_98);
                (_Var1._M_head_impl)->offset = (Expression *)pCVar6;
                wasm::Literal::~Literal(&local_98);
              }
              pcVar9 = local_48;
              puVar10 = local_40;
              puVar11 = local_50;
              if (local_68.list.
                  super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_68.list.
                                super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_68.list.
                                      super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_68.list.
                                      super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                pcVar9 = local_48;
                puVar10 = local_40;
                puVar11 = local_50;
              }
            }
            AVar14.addr = (long)*(pointer *)((long)&(_Var1._M_head_impl)->data + 8) -
                          *(long *)&((_Var1._M_head_impl)->data).
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          >> 3;
            if ((_Var1._M_head_impl)->offset->_id == '\x0e') {
              lVar5 = wasm::Literal::getInteger();
              AVar14.addr = AVar14.addr + lVar5;
              pcVar9 = local_48;
              puVar10 = local_40;
            }
            _Var7._M_head_impl =
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                 super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
            AVar2.addr = ((_Var7._M_head_impl)->initial).addr;
            if (AVar14.addr < AVar2.addr) {
              AVar14.addr = AVar2.addr;
            }
            ((_Var7._M_head_impl)->initial).addr = AVar14.addr;
          }
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar10);
      }
      uVar8 = ((_Var7._M_head_impl)->initial).addr;
      if (9999 < uVar8) {
        uVar8 = 10000;
      }
      ((_Var7._M_head_impl)->initial).addr = uVar8;
      uVar4 = Random::upTo(local_70,2);
      _Var7._M_head_impl =
           (puVar11->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      if (uVar4 == 0) {
        AVar14.addr = 0xffffffff;
      }
      else {
        AVar14.addr = ((_Var7._M_head_impl)->initial).addr;
      }
      ((_Var7._M_head_impl)->max).addr = AVar14.addr;
      if (local_38->preserveImportsAndExports == false) {
        *(undefined8 *)
         &((Name *)((long)&(_Var7._M_head_impl)->super_Importable + 0x28))->super_IString = 0;
        *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x30) = (char *)0x0;
        _Var7._M_head_impl =
             (puVar11->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        *(undefined8 *)
         &((Name *)((long)&(_Var7._M_head_impl)->super_Importable + 0x18))->super_IString = 0;
        *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x20) = (char *)0x0;
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != local_78);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::finalizeTable() {
  for (auto& table : wasm.tables) {
    ModuleUtils::iterTableSegments(
      wasm, table->name, [&](ElementSegment* segment) {
        // If the offset contains a global that was imported (which is ok) but
        // no longer is (not ok unless GC is enabled), we may need to change
        // that.
        if (!wasm.features.hasGC()) {
          for ([[maybe_unused]] auto* get :
               FindAll<GlobalGet>(segment->offset).list) {
            // No imported globals should remain.
            assert(!wasm.getGlobal(get->name)->imported());
            // TODO: the segments must not overlap...
            segment->offset =
              builder.makeConst(Literal::makeFromInt32(0, table->addressType));
          }
        }
        Address maxOffset = segment->data.size();
        if (auto* offset = segment->offset->dynCast<Const>()) {
          maxOffset = maxOffset + offset->value.getInteger();
        }
        table->initial = std::max(table->initial, maxOffset);
      });

    // The code above raises table->initial to a size large enough to accomodate
    // all of its segments, with the intention of avoiding a trap during
    // startup. However a single segment of (say) size 4GB would have a table of
    // that size, which will use a lot of memory and execute very slowly, so we
    // prefer in the fuzzer to trap on such a thing. To achieve that, set a
    // reasonable limit for the maximum table size.
    //
    // This also avoids an issue that arises from table->initial being an
    // Address (64 bits) but Table::kMaxSize being an Index (32 bits), as a
    // result of which we need to clamp to Table::kMaxSize as well in order for
    // the module to validate (but since we are clamping to a smaller value,
    // there is no need).
    const Address ReasonableMaxTableSize = 10000;
    table->initial = std::min(table->initial, ReasonableMaxTableSize);
    assert(ReasonableMaxTableSize <= Table::kMaxSize);

    table->max = oneIn(2) ? Address(Table::kUnlimitedSize) : table->initial;

    if (!preserveImportsAndExports) {
      // Avoid an imported table (which the fuzz harness would need to handle).
      table->module = table->base = Name();
    }
  }
}